

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O3

ButtonRole __thiscall QDialogButtonBox::buttonRole(QDialogButtonBox *this,QAbstractButton *button)

{
  long lVar1;
  long lVar2;
  int i;
  ulong uVar3;
  long lVar4;
  long in_FS_OFFSET;
  const_iterator cVar5;
  QAbstractButton *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  uVar3 = 0;
  do {
    lVar2 = *(long *)(lVar1 + 0x268 + uVar3 * 0x18);
    local_20 = button;
    if (lVar2 != 0) {
      lVar4 = 0;
      do {
        if (*(QAbstractButton **)(*(long *)(lVar1 + uVar3 * 0x18 + 0x260) + lVar4 * 8) == button)
        goto LAB_0046f0d6;
        lVar4 = lVar4 + 1;
      } while (lVar2 != lVar4);
    }
    uVar3 = uVar3 + 1;
  } while (uVar3 != 9);
  cVar5 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
          ::find((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                  *)(lVar1 + 0x3c0),&local_20);
  if ((cVar5.c != (containers *)(lVar1 + 0x3c0)) ||
     (uVar3 = 0xffffffff, cVar5.i != *(long *)(lVar1 + 0x3c8))) {
    uVar3 = (ulong)*(uint *)((long)((cVar5.c)->values).super_QVLABase<QDialogButtonBox::ButtonRole>.
                                   super_QVLABaseBase.ptr + cVar5.i * 4);
  }
LAB_0046f0d6:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (ButtonRole)uVar3;
  }
  __stack_chk_fail();
}

Assistant:

QDialogButtonBox::ButtonRole QDialogButtonBox::buttonRole(QAbstractButton *button) const
{
    Q_D(const QDialogButtonBox);
    for (int i = 0; i < NRoles; ++i) {
        const QList<QAbstractButton *> &list = d->buttonLists[i];
        for (int j = 0; j < list.size(); ++j) {
            if (list.at(j) == button)
                return ButtonRole(i);
        }
    }
    return d->hiddenButtons.value(button, InvalidRole);
}